

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O1

LY_ERR lysp_check_dup_features(lysp_ctx *ctx,lysp_module *mod)

{
  lysp_include *plVar1;
  LY_ERR LVar2;
  ly_ht *ht;
  ulong uVar3;
  lysp_feature *plVar4;
  ulong uVar5;
  lysp_feature *plVar6;
  lysp_feature *plVar7;
  
  LVar2 = LY_EMEM;
  ht = lyht_new(8,8,ly_ptrequal_cb,(void *)0x0,1);
  if (ht != (ly_ht *)0x0) {
    plVar4 = mod->features;
    plVar6 = plVar4;
    for (plVar7 = plVar4;
        (plVar6 != (lysp_feature *)0x0 &&
        ((ulong)((long)plVar7 - (long)plVar6) >> 6 < *(ulong *)&plVar6[-1].flags));
        plVar7 = plVar7 + 1) {
      LVar2 = lysp_check_dup_ht_insert
                        (ctx,ht,plVar4->name,"feature",
                         "name collision with another top-level feature");
      if (LVar2 != LY_SUCCESS) goto LAB_001630af;
      plVar4 = plVar4 + 1;
      plVar6 = mod->features;
    }
    uVar5 = 0;
    while( true ) {
      plVar1 = mod->includes;
      if (plVar1 == (lysp_include *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ulong *)(plVar1[-1].rev + 8);
      }
      if (uVar3 <= uVar5) break;
      plVar4 = (mod->includes[uVar5].submodule)->features;
      if (plVar4 != (lysp_feature *)0x0) {
        plVar6 = (plVar1[uVar5].submodule)->features;
        plVar7 = plVar6;
        do {
          if (*(ulong *)&plVar4[-1].flags <= (ulong)((long)plVar7 - (long)plVar4) >> 6) break;
          LVar2 = lysp_check_dup_ht_insert
                            (ctx,ht,plVar6->name,"feature",
                             "name collision with another top-level feature");
          if (LVar2 != LY_SUCCESS) goto LAB_001630af;
          plVar6 = plVar6 + 1;
          plVar4 = (mod->includes[uVar5].submodule)->features;
          plVar7 = plVar7 + 1;
        } while (plVar4 != (lysp_feature *)0x0);
      }
      uVar5 = uVar5 + 1;
    }
    LVar2 = LY_SUCCESS;
LAB_001630af:
    lyht_free(ht,(_func_void_void_ptr *)0x0);
  }
  return LVar2;
}

Assistant:

LY_ERR
lysp_check_dup_features(struct lysp_ctx *ctx, struct lysp_module *mod)
{
    LY_ARRAY_COUNT_TYPE u;
    struct ly_ht *ht;
    struct lysp_feature *f;
    LY_ERR ret = LY_SUCCESS;

    ht = lyht_new(LYHT_MIN_SIZE, sizeof(void *), ly_ptrequal_cb, NULL, 1);
    LY_CHECK_RET(!ht, LY_EMEM);

    /* add all module features into a hash table */
    LY_ARRAY_FOR(mod->features, struct lysp_feature, f) {
        ret = lysp_check_dup_ht_insert(ctx, ht, f->name, "feature",
                "name collision with another top-level feature");
        LY_CHECK_GOTO(ret, cleanup);
    }

    /* add all submodule features into a hash table */
    LY_ARRAY_FOR(mod->includes, u) {
        LY_ARRAY_FOR(mod->includes[u].submodule->features, struct lysp_feature, f) {
            ret = lysp_check_dup_ht_insert(ctx, ht, f->name, "feature",
                    "name collision with another top-level feature");
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyht_free(ht, NULL);
    return ret;
}